

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::tenaryByComponent::call
          (tenaryByComponent *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  GLuint GVar2;
  GLuint GVar3;
  GLuint GVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  GLuint component;
  ulong uVar9;
  undefined8 uVar10;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,0);
  GVar3 = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,1);
  GVar4 = GPUShaderFP64Test10::functionObject::getArgumentComponents((functionObject *)this,2);
  uVar8 = GVar3;
  if (GVar3 < GVar2) {
    uVar8 = GVar2;
  }
  if (uVar8 <= GVar4) {
    uVar8 = GVar4;
  }
  pcVar1 = (code *)(this->super_tenaryBase).super_functionObject.m_p_function;
  for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    uVar6 = uVar9;
    if (GVar2 == 1) {
      uVar6 = 0;
    }
    iVar7 = (int)uVar9;
    if (GVar3 == 1) {
      iVar7 = 0;
    }
    iVar5 = (int)uVar9;
    if (GVar4 == 1) {
      iVar5 = 0;
    }
    uVar10 = (*pcVar1)(*(undefined8 *)((long)argument_src + uVar6 * 8),
                       *(undefined8 *)((long)argument_src + (ulong)(iVar7 + GVar2) * 8),
                       *(undefined8 *)((long)argument_src + (ulong)(iVar5 + GVar3 + GVar2) * 8));
    *(undefined8 *)((long)result_dst + uVar9 * 8) = uVar10;
  }
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		glw::GLdouble*		 p_result = (glw::GLdouble*)result_dst;
		const glw::GLdouble* p_arg	= (const glw::GLdouble*)argument_src;

		const glw::GLuint n_components_0 = getArgumentComponents(0);
		const glw::GLuint n_components_1 = getArgumentComponents(1);
		const glw::GLuint n_components_2 = getArgumentComponents(2);
		const glw::GLuint n_components   = de::max(de::max(n_components_0, n_components_1), n_components_2);

		const glw::GLuint component_step_0 = (1 == n_components_0) ? 0 : 1;
		const glw::GLuint component_step_1 = (1 == n_components_1) ? 0 : 1;
		const glw::GLuint component_step_2 = (1 == n_components_2) ? 0 : 1;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLdouble first_arg  = p_arg[component * component_step_0];
			const glw::GLdouble second_arg = p_arg[component * component_step_1 + n_components_0];
			const glw::GLdouble third_arg  = p_arg[component * component_step_2 + n_components_0 + n_components_1];

			p_result[component] = p_function(first_arg, second_arg, third_arg);
		}
	}